

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::delaunayrefinement(tetgenmesh *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  arraypool *paVar9;
  memorypool *pmVar10;
  void *pvVar11;
  undefined8 *puVar12;
  tetrahedron *pppdVar13;
  long *plVar14;
  tetgenbehavior *ptVar15;
  long lVar16;
  void **ppvVar17;
  
  lVar2 = this->flip32count;
  lVar3 = this->flip23count;
  ptVar15 = this->b;
  lVar4 = this->flip44count;
  if (ptVar15->quiet == 0) {
    puts("Refining mesh...");
    ptVar15 = this->b;
  }
  if (ptVar15->verbose != 0) {
    printf("  Min radiu-edge ratio = %g.\n",SUB84(ptVar15->minratio,0));
    printf("  Min dihedral   angle = %g.\n",SUB84(this->b->mindihedral,0));
    ptVar15 = this->b;
  }
  lVar7 = (long)ptVar15->steinerleft;
  this->steinerleft = lVar7;
  if (0 < lVar7) {
    lVar16 = this->st_facref_count + this->st_segref_count + this->st_volref_count;
    lVar8 = lVar7 - lVar16;
    if (lVar8 == 0 || lVar7 < lVar16) {
      if (ptVar15->quiet != 0) {
        return;
      }
      printf("\nWarning:  ");
      printf("The desired number of Steiner points (%d) has reached.\n\n",
             (ulong)(uint)this->b->steinerleft);
      return;
    }
    this->steinerleft = lVar8;
  }
  if ((this->useinsertradius != 0) &&
     (((ptVar15->plc != 0 && (ptVar15->nobisect != 0)) || (ptVar15->refine != 0)))) {
    makesegmentendpointsmap(this);
    makefacetverticesmap(this);
    ptVar15 = this->b;
  }
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x10;
  paVar9->objectsperblock = 0x100;
  paVar9->log2objectsperblock = 8;
  paVar9->objectsperblockmark = 0xff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->encseglist = paVar9;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x88;
  paVar9->objectsperblock = 0x100;
  paVar9->log2objectsperblock = 8;
  paVar9->objectsperblockmark = 0xff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->encshlist = paVar9;
  if ((ptVar15->nobisect == 0) || (this->checkconstraints != 0)) {
    if (ptVar15->verbose != 0) {
      puts("  Splitting encroached subsegments.");
      ptVar15 = this->b;
    }
    lVar7 = this->points->items;
    pmVar10 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar10,0x10,ptVar15->shellfaceperblock,8,0);
    this->badsubsegs = pmVar10;
    pmVar10 = this->subsegs;
    ppvVar17 = pmVar10->firstblock;
    pmVar10->pathblock = ppvVar17;
    pmVar10->pathitem =
         (void *)((long)ppvVar17 +
                 (((long)pmVar10->alignbytes + 8U) -
                 (ulong)(ppvVar17 + 1) % (ulong)(long)pmVar10->alignbytes));
    pmVar10->pathitemsleft = pmVar10->itemsperblock;
    while (pvVar11 = memorypool::traverse(pmVar10), pvVar11 != (void *)0x0) {
      if (*(long *)((long)pvVar11 + 0x18) != 0) {
        do {
          uVar1 = *(uint *)((long)pvVar11 + (long)this->shmarkindex * 4 + 4);
          if ((uVar1 & 4) == 0) {
            pmVar10 = this->badsubsegs;
            *(uint *)((long)pvVar11 + (long)this->shmarkindex * 4 + 4) = uVar1 | 4;
            puVar12 = (undefined8 *)memorypool::alloc(pmVar10);
            *puVar12 = pvVar11;
            *(undefined4 *)(puVar12 + 1) = 0;
          }
          pmVar10 = this->subsegs;
          do {
            pvVar11 = memorypool::traverse(pmVar10);
            if (pvVar11 == (void *)0x0) goto LAB_001457ce;
          } while (*(long *)((long)pvVar11 + 0x18) == 0);
        } while( true );
      }
    }
LAB_001457ce:
    repairencsegs(this,1);
    ptVar15 = this->b;
    if (ptVar15->verbose != 0) {
      printf("  Added %ld Steiner points.\n",this->points->items - lVar7);
      ptVar15 = this->b;
    }
    if (1 < ptVar15->reflevel) {
      if (ptVar15->verbose != 0) {
        puts("  Splitting encroached subfaces.");
        ptVar15 = this->b;
      }
      lVar7 = this->points->items;
      lVar8 = this->st_segref_count;
      lVar16 = this->st_facref_count;
      pmVar10 = (memorypool *)operator_new(0x58);
      memorypool::poolinit(pmVar10,0x10,ptVar15->shellfaceperblock,8,0);
      this->badsubfacs = pmVar10;
      pmVar10 = this->subfaces;
      ppvVar17 = pmVar10->firstblock;
      pmVar10->pathblock = ppvVar17;
      pmVar10->pathitem =
           (void *)((long)ppvVar17 +
                   (((long)pmVar10->alignbytes + 8U) -
                   (ulong)(ppvVar17 + 1) % (ulong)(long)pmVar10->alignbytes));
      pmVar10->pathitemsleft = pmVar10->itemsperblock;
      while (pvVar11 = memorypool::traverse(pmVar10), pvVar11 != (void *)0x0) {
        if (*(long *)((long)pvVar11 + 0x18) != 0) {
          do {
            uVar1 = *(uint *)((long)pvVar11 + (long)this->shmarkindex * 4 + 4);
            if ((uVar1 & 4) == 0) {
              pmVar10 = this->badsubfacs;
              *(uint *)((long)pvVar11 + (long)this->shmarkindex * 4 + 4) = uVar1 | 4;
              puVar12 = (undefined8 *)memorypool::alloc(pmVar10);
              *puVar12 = pvVar11;
              *(undefined4 *)(puVar12 + 1) = 0;
            }
            pmVar10 = this->subfaces;
            do {
              pvVar11 = memorypool::traverse(pmVar10);
              if (pvVar11 == (void *)0x0) goto LAB_0014594b;
            } while (*(long *)((long)pvVar11 + 0x18) == 0);
          } while( true );
        }
      }
LAB_0014594b:
      repairencfacs(this,2);
      ptVar15 = this->b;
      if (ptVar15->verbose != 0) {
        printf("  Added %ld (%ld,%ld) Steiner points.\n",this->points->items - lVar7,
               this->st_segref_count - lVar8,this->st_facref_count - lVar16);
        ptVar15 = this->b;
      }
    }
  }
  if (2 < ptVar15->reflevel) {
    if (ptVar15->verbose != 0) {
      puts("  Splitting bad quality tets.");
      ptVar15 = this->b;
    }
    lVar7 = this->points->items;
    lVar8 = this->st_segref_count;
    lVar16 = this->st_facref_count;
    lVar5 = this->st_volref_count;
    dVar6 = cos((ptVar15->mindihedral / 180.0) * PI);
    this->cosmindihed = dVar6;
    pmVar10 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar10,0x10,this->b->tetrahedraperblock,8,0);
    this->badtetrahedrons = pmVar10;
    pmVar10 = this->tetrahedrons;
    ppvVar17 = pmVar10->firstblock;
    pmVar10->pathblock = ppvVar17;
    pmVar10->pathitem =
         (void *)((long)ppvVar17 +
                 (((long)pmVar10->alignbytes + 8U) -
                 (ulong)(ppvVar17 + 1) % (ulong)(long)pmVar10->alignbytes));
    pmVar10->pathitemsleft = pmVar10->itemsperblock;
    pppdVar13 = tetrahedrontraverse(this);
    while (pppdVar13 != (tetrahedron *)0x0) {
      uVar1 = *(uint *)((long)pppdVar13 + (long)this->elemmarkerindex * 4);
      if ((uVar1 >> 0xc & 1) == 0) {
        *(uint *)((long)pppdVar13 + (long)this->elemmarkerindex * 4) = uVar1 | 0x1000;
        plVar14 = (long *)memorypool::alloc(this->badtetrahedrons);
        *plVar14 = (long)pppdVar13;
        *(undefined4 *)(plVar14 + 1) = 0;
      }
      pppdVar13 = tetrahedrontraverse(this);
    }
    repairbadtets(this,4);
    ptVar15 = this->b;
    if (ptVar15->verbose != 0) {
      printf("  Added %ld (%ld,%ld,%ld) Steiner points.\n",this->points->items - lVar7,
             this->st_segref_count - lVar8,this->st_facref_count - lVar16,
             this->st_volref_count - lVar5);
      ptVar15 = this->b;
    }
  }
  if ((ptVar15->verbose != 0) &&
     (lVar2 + lVar3 + lVar4 < this->flip32count + this->flip23count + this->flip44count)) {
    printf("  Performed %ld flips.\n");
  }
  if ((this->steinerleft == 0) && (this->b->quiet == 0)) {
    printf("\nWarnning:  ");
    printf("The desired number of Steiner points (%d) is reached.\n\n",
           (ulong)(uint)this->b->steinerleft);
  }
  paVar9 = this->encseglist;
  if (paVar9 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar9);
  }
  operator_delete(paVar9,0x30);
  paVar9 = this->encshlist;
  if (paVar9 != (arraypool *)0x0) {
    arraypool::~arraypool(paVar9);
  }
  operator_delete(paVar9,0x30);
  this->encseglist = (arraypool *)0x0;
  this->encshlist = (arraypool *)0x0;
  ptVar15 = this->b;
  if ((ptVar15->nobisect == 0) || (this->checkconstraints != 0)) {
    pmVar10 = this->badsubsegs;
    this->totalworkmemory = this->totalworkmemory + (long)pmVar10->itembytes * pmVar10->maxitems;
    ppvVar17 = pmVar10->firstblock;
    while (ppvVar17 != (void **)0x0) {
      pmVar10->nowblock = (void **)*ppvVar17;
      free(ppvVar17);
      ppvVar17 = pmVar10->nowblock;
      pmVar10->firstblock = ppvVar17;
    }
    operator_delete(pmVar10,0x58);
    this->badsubsegs = (memorypool *)0x0;
    ptVar15 = this->b;
    if (1 < ptVar15->reflevel) {
      pmVar10 = this->badsubfacs;
      this->totalworkmemory = this->totalworkmemory + (long)pmVar10->itembytes * pmVar10->maxitems;
      ppvVar17 = pmVar10->firstblock;
      while (ppvVar17 != (void **)0x0) {
        pmVar10->nowblock = (void **)*ppvVar17;
        free(ppvVar17);
        ppvVar17 = pmVar10->nowblock;
        pmVar10->firstblock = ppvVar17;
      }
      operator_delete(pmVar10,0x58);
      this->badsubfacs = (memorypool *)0x0;
      ptVar15 = this->b;
    }
  }
  if (2 < ptVar15->reflevel) {
    pmVar10 = this->badtetrahedrons;
    this->totalworkmemory = this->totalworkmemory + (long)pmVar10->itembytes * pmVar10->maxitems;
    ppvVar17 = pmVar10->firstblock;
    while (ppvVar17 != (void **)0x0) {
      pmVar10->nowblock = (void **)*ppvVar17;
      free(ppvVar17);
      ppvVar17 = pmVar10->nowblock;
      pmVar10->firstblock = ppvVar17;
    }
    operator_delete(pmVar10,0x58);
    this->badtetrahedrons = (memorypool *)0x0;
  }
  return;
}

Assistant:

void tetgenmesh::delaunayrefinement()
{
  triface checktet;
  face checksh;
  face checkseg;
  long steinercount;
  int chkencflag;

  long bak_segref_count, bak_facref_count, bak_volref_count;
  long bak_flipcount = flip23count + flip32count + flip44count;

  if (!b->quiet) {
    printf("Refining mesh...\n");
  }

  if (b->verbose) {
    printf("  Min radiu-edge ratio = %g.\n", b->minratio);
    printf("  Min dihedral   angle = %g.\n", b->mindihedral);
    //printf("  Min Edge length = %g.\n", b->minedgelength);
  }

  steinerleft = b->steinerleft;  // Upperbound of # Steiner points (by -S#).
  if (steinerleft > 0) {
    // Check if we've already used up the given number of Steiner points.
    steinercount = st_segref_count + st_facref_count + st_volref_count;
    if (steinercount < steinerleft) {
      steinerleft -= steinercount;
    } else {
      if (!b->quiet) {
        printf("\nWarning:  ");
        printf("The desired number of Steiner points (%d) has reached.\n\n",
               b->steinerleft);
      }
      return; // No more Steiner points.
    }
  }

  if (useinsertradius) {
    if ((b->plc && b->nobisect) || b->refine) { // '-pY' or '-r' option.
      makesegmentendpointsmap();
      makefacetverticesmap();
    }
  }


  encseglist = new arraypool(sizeof(face), 8);
  encshlist = new arraypool(sizeof(badface), 8);


  //if (!b->nobisect) { // if no '-Y' option
  if (!b->nobisect || checkconstraints) {
    if (b->verbose) {
      printf("  Splitting encroached subsegments.\n");
    }

    chkencflag = 1; // Only check encroaching subsegments.
    steinercount = points->items;

    // Initialize the pool of encroached subsegments.
    badsubsegs = new memorypool(sizeof(face), b->shellfaceperblock, 
                                sizeof(void *), 0);

    // Add all segments into the pool.
    subsegs->traversalinit();
    checkseg.sh = shellfacetraverse(subsegs);
    while (checkseg.sh != (shellface *) NULL) {
      enqueuesubface(badsubsegs, &checkseg);
      checkseg.sh = shellfacetraverse(subsegs);
    }

    // Split all encroached segments.
    repairencsegs(chkencflag);

    if (b->verbose) {
      printf("  Added %ld Steiner points.\n", points->items - steinercount);
    }

    if (b->reflevel > 1) { // '-D2' option
      if (b->verbose) {
        printf("  Splitting encroached subfaces.\n");
      }

      chkencflag = 2; // Only check encroaching subfaces.
      steinercount = points->items;
      bak_segref_count = st_segref_count;
      bak_facref_count = st_facref_count;

      // Initialize the pool of encroached subfaces.
      badsubfacs = new memorypool(sizeof(face), b->shellfaceperblock, 
                                  sizeof(void *), 0);

      // Add all subfaces into the pool.
      subfaces->traversalinit();
      checksh.sh = shellfacetraverse(subfaces);
      while (checksh.sh != (shellface *) NULL) {
        enqueuesubface(badsubfacs, &checksh);
        checksh.sh = shellfacetraverse(subfaces);
      }

      // Split all encroached subfaces.
      repairencfacs(chkencflag);

      if (b->verbose) {
        printf("  Added %ld (%ld,%ld) Steiner points.\n",  
               points->items-steinercount, st_segref_count-bak_segref_count,
               st_facref_count-bak_facref_count);
      }
    } // if (b->reflevel > 1)
  } // if (!b->nobisect)

  if (b->reflevel > 2) { // '-D3' option (The default option)
    if (b->verbose) {
      printf("  Splitting bad quality tets.\n");
    }

    chkencflag = 4; // Only check tetrahedra.
    steinercount = points->items;
    bak_segref_count = st_segref_count;
    bak_facref_count = st_facref_count;
    bak_volref_count = st_volref_count;

    // The cosine value of the min dihedral angle (-qq) for tetrahedra.
    cosmindihed = cos(b->mindihedral / 180.0 * PI);

    // Initialize the pool of bad quality tetrahedra.
    badtetrahedrons = new memorypool(sizeof(triface), b->tetrahedraperblock,
                                     sizeof(void *), 0);
    // Add all tetrahedra (no hull tets) into the pool.
    tetrahedrons->traversalinit();
    checktet.tet = tetrahedrontraverse();
    while (checktet.tet != NULL) {
      enqueuetetrahedron(&checktet);
      checktet.tet = tetrahedrontraverse();
    }

    // Split all bad quality tetrahedra.
    repairbadtets(chkencflag);

    if (b->verbose) {
      printf("  Added %ld (%ld,%ld,%ld) Steiner points.\n", 
             points->items - steinercount, 
             st_segref_count - bak_segref_count,
             st_facref_count - bak_facref_count,
             st_volref_count - bak_volref_count);
    }
  } // if (b->reflevel > 2)

  if (b->verbose) {
    if (flip23count + flip32count + flip44count > bak_flipcount) {
      printf("  Performed %ld flips.\n", flip23count + flip32count +
             flip44count - bak_flipcount);
    }
  }

  if (steinerleft == 0) {
    if (!b->quiet) {
      printf("\nWarnning:  ");
      printf("The desired number of Steiner points (%d) is reached.\n\n",
             b->steinerleft);
    }
  }


  delete encseglist;
  delete encshlist;
  encseglist = NULL;
  encshlist = NULL;

  if (!b->nobisect || checkconstraints) {
    totalworkmemory += (badsubsegs->maxitems * badsubsegs->itembytes);
    delete badsubsegs;
    badsubsegs = NULL;
    if (b->reflevel > 1) {
      totalworkmemory += (badsubfacs->maxitems * badsubfacs->itembytes);
      delete badsubfacs;
      badsubfacs = NULL;
    }
  }
  if (b->reflevel > 2) {
    totalworkmemory += (badtetrahedrons->maxitems*badtetrahedrons->itembytes);
    delete badtetrahedrons;
    badtetrahedrons = NULL;
  }
}